

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O3

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  uint uVar2;
  long *__addr;
  MCode *__addr_00;
  ulong uVar3;
  ulong uVar4;
  ulong __len;
  int iVar5;
  
  pMVar1 = J->mcarea;
  uVar4 = (long)J->param[0xc] * 0x400 + 0xfff;
  __len = uVar4 & 0xfffffffffffff000;
  __addr_00 = pMVar1 + -__len;
  if (pMVar1 == (MCode *)0x0) {
    __addr_00 = (MCode *)0x0;
  }
  iVar5 = 0;
  do {
    if ((__addr_00 + -1 < (MCode *)0x7fffffffffff) &&
       (__addr = (long *)mmap64(__addr_00,__len,3,0x22,-1,0), __addr != (long *)0xffffffffffffffff))
    {
      if (__addr < (long *)0x800000000000 && __addr != (long *)0x0) {
        if (((__len - 0x150000) + (long)__addr < 0x3fe00000) ||
           (0x150000U - (long)__addr < 0x3fe00000)) {
          J->mcarea = (MCode *)__addr;
          J->szmcarea = __len;
          J->mcprot = 3;
          J->mctop = (MCode *)((long)__addr + __len);
          J->mcbot = (MCode *)(__addr + 2);
          *__addr = (long)pMVar1;
          __addr[1] = __len;
          J->szallmcarea = J->szallmcarea + __len;
          return;
        }
      }
      else if (__addr == (long *)0x0) goto LAB_0013debc;
      munmap(__addr,__len);
    }
LAB_0013debc:
    uVar2 = J->prngstate;
    do {
      uVar2 = uVar2 * 0x41c64e6d + 0x3039;
      uVar3 = (ulong)(uVar2 >> 1 & 0x7fff0000 ^ 0x78fb0000);
    } while (0x3fdfffff < uVar3 + uVar4);
    J->prngstate = uVar2;
    __addr_00 = (MCode *)(uVar3 - 0x1fdb0000);
    iVar5 = iVar5 + 1;
    if (iVar5 == 0x20) {
      lj_trace_err(J,LJ_TRERR_MCODEAL);
    }
  } while( true );
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
}